

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

int __thiscall Fl_Tree_Item::event_on_collapse_icon(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  char cVar1;
  int iVar2;
  Fl_Tree_Prefs *prefs_local;
  Fl_Tree_Item *this_local;
  
  iVar2 = is_visible(this);
  if ((((iVar2 == 0) || (cVar1 = is_active(this), cVar1 == '\0')) ||
      (iVar2 = has_children(this), iVar2 == 0)) ||
     (cVar1 = Fl_Tree_Prefs::showcollapse(prefs), cVar1 == '\0')) {
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = event_inside(this->_collapse_xywh);
    this_local._4_4_ = (uint)(iVar2 != 0);
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree_Item::event_on_collapse_icon(const Fl_Tree_Prefs &prefs) const {
  if ( is_visible() && is_active() && has_children() && prefs.showcollapse() ) {
    return(event_inside(_collapse_xywh) ? 1 : 0);
  } else {
    return(0);
  }
}